

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O1

Result * __thiscall
testing::internal::ReturnAction<ot::commissioner::Error>::
Impl<ot::commissioner::Error,_ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
::Perform(Result *__return_storage_ptr__,
         Impl<ot::commissioner::Error,_ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
         *this,ArgumentTuple *param_1)

{
  pointer pcVar1;
  
  __return_storage_ptr__->mCode = (this->value_).mCode;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  pcVar1 = (this->value_).mMessage._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->mMessage,pcVar1,
             pcVar1 + (this->value_).mMessage._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

Result Perform(const ArgumentTuple&) override { return value_; }